

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char zDirname [513];
  
  sqlite3_snprintf(0x200,zDirname,"%s",zFilename);
  sVar2 = strlen(zDirname);
  for (uVar3 = sVar2 & 0xffffffff; 1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    if (zDirname[uVar3] == '/') goto LAB_00124111;
  }
  if ((int)sVar2 < 1) {
    *pFd = -1;
  }
  else {
    uVar3 = 1;
LAB_00124111:
    zDirname[uVar3] = '\0';
    iVar1 = robust_open(zDirname,0,0);
    *pFd = iVar1;
    if (-1 < iVar1) {
      return 0;
    }
  }
  sqlite3CantopenError(0x67e1);
  unixLogErrorAtLine(0xe,"open",zDirname,0x67e1);
  return 0xe;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>1 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
    fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
    if( fd>=0 ){
      OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
    }
  }
  *pFd = fd;
  return (fd>=0?SQLITE_OK:unixLogError(SQLITE_CANTOPEN_BKPT, "open", zDirname));
}